

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidgload.c
# Opt level: O1

FT_Error cid_slot_load_glyph(FT_GlyphSlot cidglyph,FT_Size cidsize,FT_UInt glyph_index,
                            FT_Int32 load_flags)

{
  FT_Pos *pFVar1;
  byte *pbVar2;
  FT_Outline *outline;
  char cVar3;
  char cVar4;
  FT_Face pFVar5;
  long lVar6;
  FT_Slot_Internal pFVar7;
  uint uVar8;
  FT_Error FVar9;
  int iVar10;
  FT_Fixed FVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  FT_Vector *pFVar15;
  bool bVar16;
  FT_Matrix font_matrix;
  FT_BBox cbox;
  T1_DecoderRec decoder;
  
  pFVar5 = cidglyph->face;
  lVar6 = pFVar5[1].face_index;
  FVar9 = 6;
  bVar16 = true;
  if ((uint)pFVar5->num_glyphs <= glyph_index) goto LAB_0022a652;
  uVar8 = load_flags | 3;
  if (((uint)load_flags >> 10 & 1) == 0) {
    uVar8 = load_flags;
  }
  cidglyph[1].face = (FT_Face)(cidsize->metrics).x_scale;
  cidglyph[1].next = (FT_GlyphSlot)(cidsize->metrics).y_scale;
  (cidglyph->outline).n_contours = 0;
  (cidglyph->outline).n_points = 0;
  bVar16 = (uVar8 & 3) == 0;
  *(bool *)&cidglyph[1].library = bVar16;
  *(byte *)((long)&cidglyph[1].library + 1) = (byte)(uVar8 & 1) ^ 1;
  cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;
  FVar9 = (*(code *)**(undefined8 **)(lVar6 + 0x18))
                    (&decoder,pFVar5,cidsize,cidglyph,0,0,bVar16,uVar8 >> 0x10 & 0xf,cid_load_glyph)
  ;
  if (FVar9 == 0) {
    decoder.builder.no_recurse = (FT_Bool)((uVar8 & 0x400) >> 10);
    FVar9 = cid_load_glyph(&decoder,glyph_index);
    if (FVar9 != 0) {
      bVar16 = false;
      goto LAB_0022a652;
    }
    cVar3 = *(char *)&cidglyph[1].library;
    cVar4 = *(char *)((long)&cidglyph[1].library + 1);
    font_matrix.yx._0_4_ = (undefined4)decoder.font_matrix.yx;
    font_matrix.yx._4_4_ = decoder.font_matrix.yx._4_4_;
    font_matrix.yy._0_4_ = (int)decoder.font_matrix.yy;
    font_matrix.yy._4_4_ = decoder.font_matrix.yy._4_4_;
    font_matrix.xx._0_4_ = (int)decoder.font_matrix.xx;
    font_matrix.xx._4_4_ = decoder.font_matrix.xx._4_4_;
    font_matrix.xy._0_4_ = (undefined4)decoder.font_matrix.xy;
    font_matrix.xy._4_4_ = decoder.font_matrix.xy._4_4_;
    (**(code **)(*(long *)(lVar6 + 0x18) + 8))();
    (cidglyph->outline).flags = (cidglyph->outline).flags & 1U | 4;
    if ((uVar8 & 0x400) == 0) {
      FVar11 = FT_RoundFix(decoder.builder.advance.x);
      (cidglyph->metrics).horiAdvance = FVar11 >> 0x10;
      FVar11 = FT_RoundFix(decoder.builder.advance.x);
      cidglyph->linearHoriAdvance = FVar11 >> 0x10;
      cidglyph->internal->glyph_transformed = '\0';
      lVar12 = *(long *)&pFVar5[1].max_advance_width - pFVar5[1].bbox.yMax >> 0x10;
      (cidglyph->metrics).vertAdvance = lVar12;
      cidglyph->linearVertAdvance = lVar12;
      cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;
      if ((cidsize->metrics).y_ppem < 0x18) {
        pbVar2 = (byte *)((long)&(cidglyph->outline).flags + 1);
        *pbVar2 = *pbVar2 | 1;
      }
      outline = &cidglyph->outline;
      if ((((CONCAT44(font_matrix.xx._4_4_,(int)font_matrix.xx) != 0x10000) ||
           (CONCAT44(font_matrix.yy._4_4_,(int)font_matrix.yy) != 0x10000)) ||
          (CONCAT44(font_matrix.xy._4_4_,(undefined4)font_matrix.xy) != 0)) ||
         (CONCAT44(font_matrix.yx._4_4_,(undefined4)font_matrix.yx) != 0)) {
        FT_Outline_Transform(outline,&font_matrix);
        lVar12 = (long)(int)font_matrix.xx * (long)(int)(cidglyph->metrics).horiAdvance;
        (cidglyph->metrics).horiAdvance =
             (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
        lVar12 = (long)(int)font_matrix.yy * (long)(int)(cidglyph->metrics).vertAdvance;
        (cidglyph->metrics).vertAdvance =
             (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      }
      if (decoder.font_offset.x != 0 || decoder.font_offset.y != 0) {
        FT_Outline_Translate(outline,decoder.font_offset.x,decoder.font_offset.y);
        pFVar1 = &(cidglyph->metrics).horiAdvance;
        *pFVar1 = *pFVar1 + decoder.font_offset.x;
        pFVar1 = &(cidglyph->metrics).vertAdvance;
        *pFVar1 = *pFVar1 + decoder.font_offset.y;
      }
      if (((uVar8 & 1) == 0) || (cVar4 != '\0')) {
        iVar13 = (int)cidglyph[1].face;
        iVar10 = (int)cidglyph[1].next;
        if (((cVar3 == '\0') || (decoder.builder.hints_funcs == (void *)0x0)) &&
           (0 < (decoder.builder.base)->n_points)) {
          pFVar15 = (decoder.builder.base)->points;
          iVar14 = (decoder.builder.base)->n_points + 1;
          do {
            lVar12 = (long)(int)pFVar15->x * (long)iVar13;
            pFVar15->x = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
            lVar12 = (long)(int)pFVar15->y * (long)iVar10;
            pFVar15->y = (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
            pFVar15 = pFVar15 + 1;
            iVar14 = iVar14 + -1;
          } while (1 < iVar14);
        }
        lVar12 = (long)iVar13 * (long)(int)(cidglyph->metrics).horiAdvance;
        (cidglyph->metrics).horiAdvance =
             (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
        lVar12 = (long)iVar10 * (long)(int)(cidglyph->metrics).vertAdvance;
        (cidglyph->metrics).vertAdvance =
             (long)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      }
      FT_Outline_Get_CBox(outline,&cbox);
      (cidglyph->metrics).width = cbox.xMax - cbox.xMin;
      (cidglyph->metrics).height = cbox.yMax - cbox.yMin;
      (cidglyph->metrics).horiBearingX = cbox.xMin;
      (cidglyph->metrics).horiBearingY = cbox.yMax;
      if ((uVar8 & 0x10) != 0) {
        ft_synthesize_vertical_metrics(&cidglyph->metrics,(cidglyph->metrics).vertAdvance);
      }
      FVar9 = 0;
      bVar16 = true;
      goto LAB_0022a652;
    }
    pFVar7 = cidglyph->internal;
    FVar11 = FT_RoundFix(decoder.builder.left_bearing.x);
    (cidglyph->metrics).horiBearingX = FVar11 >> 0x10;
    FVar11 = FT_RoundFix(decoder.builder.advance.x);
    (cidglyph->metrics).horiAdvance = FVar11 >> 0x10;
    (pFVar7->glyph_matrix).xx = CONCAT44(font_matrix.xx._4_4_,(int)font_matrix.xx);
    (pFVar7->glyph_matrix).xy = CONCAT44(font_matrix.xy._4_4_,(undefined4)font_matrix.xy);
    (pFVar7->glyph_matrix).yx = CONCAT44(font_matrix.yx._4_4_,(undefined4)font_matrix.yx);
    (pFVar7->glyph_matrix).yy = CONCAT44(font_matrix.yy._4_4_,(int)font_matrix.yy);
    (pFVar7->glyph_delta).x = decoder.font_offset.x;
    (pFVar7->glyph_delta).y = decoder.font_offset.y;
    pFVar7->glyph_transformed = '\x01';
    FVar9 = 0;
  }
  bVar16 = true;
LAB_0022a652:
  if (!bVar16) {
    (**(code **)(*(long *)(lVar6 + 0x18) + 8))(&decoder);
  }
  return FVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_slot_load_glyph( FT_GlyphSlot  cidglyph,      /* CID_GlyphSlot */
                       FT_Size       cidsize,       /* CID_Size      */
                       FT_UInt       glyph_index,
                       FT_Int32      load_flags )
  {
    CID_GlyphSlot  glyph = (CID_GlyphSlot)cidglyph;
    FT_Error       error;
    T1_DecoderRec  decoder;
    CID_Face       face = (CID_Face)cidglyph->face;
    FT_Bool        hinting;
    FT_Bool        scaled;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;
    FT_Matrix      font_matrix;
    FT_Vector      font_offset;
    FT_Bool        must_finish_decoder = FALSE;


    if ( glyph_index >= (FT_UInt)face->root.num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    if ( load_flags & FT_LOAD_NO_RECURSE )
      load_flags |= FT_LOAD_NO_SCALE | FT_LOAD_NO_HINTING;

    glyph->x_scale = cidsize->metrics.x_scale;
    glyph->y_scale = cidsize->metrics.y_scale;

    cidglyph->outline.n_points   = 0;
    cidglyph->outline.n_contours = 0;

    hinting = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 &&
                       ( load_flags & FT_LOAD_NO_HINTING ) == 0 );
    scaled  = FT_BOOL( ( load_flags & FT_LOAD_NO_SCALE   ) == 0 );

    glyph->hint      = hinting;
    glyph->scaled    = scaled;
    cidglyph->format = FT_GLYPH_FORMAT_OUTLINE;

    error = psaux->t1_decoder_funcs->init( &decoder,
                                           cidglyph->face,
                                           cidsize,
                                           cidglyph,
                                           0, /* glyph names -- XXX */
                                           0, /* blend == 0 */
                                           hinting,
                                           FT_LOAD_TARGET_MODE( load_flags ),
                                           cid_load_glyph );
    if ( error )
      goto Exit;

    /* TODO: initialize decoder.len_buildchar and decoder.buildchar */
    /*       if we ever support CID-keyed multiple master fonts     */

    must_finish_decoder = TRUE;

    /* set up the decoder */
    decoder.builder.no_recurse = FT_BOOL( load_flags & FT_LOAD_NO_RECURSE );

    error = cid_load_glyph( &decoder, glyph_index );
    if ( error )
      goto Exit;

    /* copy flags back for forced scaling */
    hinting = glyph->hint;
    scaled  = glyph->scaled;

    font_matrix = decoder.font_matrix;
    font_offset = decoder.font_offset;

    /* save new glyph tables */
    psaux->t1_decoder_funcs->done( &decoder );

    must_finish_decoder = FALSE;

    /* now set the metrics -- this is rather simple, as    */
    /* the left side bearing is the xMin, and the top side */
    /* bearing the yMax                                    */
    cidglyph->outline.flags &= FT_OUTLINE_OWNER;
    cidglyph->outline.flags |= FT_OUTLINE_REVERSE_FILL;

    /* for composite glyphs, return only left side bearing and */
    /* advance width                                           */
    if ( load_flags & FT_LOAD_NO_RECURSE )
    {
      FT_Slot_Internal  internal = cidglyph->internal;


      cidglyph->metrics.horiBearingX =
        FIXED_TO_INT( decoder.builder.left_bearing.x );
      cidglyph->metrics.horiAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );

      internal->glyph_matrix      = font_matrix;
      internal->glyph_delta       = font_offset;
      internal->glyph_transformed = 1;
    }
    else
    {
      FT_BBox            cbox;
      FT_Glyph_Metrics*  metrics = &cidglyph->metrics;


      /* copy the _unscaled_ advance width */
      metrics->horiAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );
      cidglyph->linearHoriAdvance =
        FIXED_TO_INT( decoder.builder.advance.x );
      cidglyph->internal->glyph_transformed = 0;

      /* make up vertical ones */
      metrics->vertAdvance        = ( face->cid.font_bbox.yMax -
                                      face->cid.font_bbox.yMin ) >> 16;
      cidglyph->linearVertAdvance = metrics->vertAdvance;

      cidglyph->format            = FT_GLYPH_FORMAT_OUTLINE;

      if ( cidsize->metrics.y_ppem < 24 )
        cidglyph->outline.flags |= FT_OUTLINE_HIGH_PRECISION;

      /* apply the font matrix, if any */
      if ( font_matrix.xx != 0x10000L || font_matrix.yy != 0x10000L ||
           font_matrix.xy != 0        || font_matrix.yx != 0        )
      {
        FT_Outline_Transform( &cidglyph->outline, &font_matrix );

        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance,
                                          font_matrix.xx );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance,
                                          font_matrix.yy );
      }

      if ( font_offset.x || font_offset.y )
      {
        FT_Outline_Translate( &cidglyph->outline,
                              font_offset.x,
                              font_offset.y );

        metrics->horiAdvance += font_offset.x;
        metrics->vertAdvance += font_offset.y;
      }

      if ( ( load_flags & FT_LOAD_NO_SCALE ) == 0 || scaled )
      {
        /* scale the outline and the metrics */
        FT_Int       n;
        FT_Outline*  cur = decoder.builder.base;
        FT_Vector*   vec = cur->points;
        FT_Fixed     x_scale = glyph->x_scale;
        FT_Fixed     y_scale = glyph->y_scale;


        /* First of all, scale the points */
        if ( !hinting || !decoder.builder.hints_funcs )
          for ( n = cur->n_points; n > 0; n--, vec++ )
          {
            vec->x = FT_MulFix( vec->x, x_scale );
            vec->y = FT_MulFix( vec->y, y_scale );
          }

        /* Then scale the metrics */
        metrics->horiAdvance = FT_MulFix( metrics->horiAdvance, x_scale );
        metrics->vertAdvance = FT_MulFix( metrics->vertAdvance, y_scale );
      }

      /* compute the other metrics */
      FT_Outline_Get_CBox( &cidglyph->outline, &cbox );

      metrics->width  = cbox.xMax - cbox.xMin;
      metrics->height = cbox.yMax - cbox.yMin;

      metrics->horiBearingX = cbox.xMin;
      metrics->horiBearingY = cbox.yMax;

      if ( load_flags & FT_LOAD_VERTICAL_LAYOUT )
      {
        /* make up vertical ones */
        ft_synthesize_vertical_metrics( metrics,
                                        metrics->vertAdvance );
      }
    }

  Exit:

    if ( must_finish_decoder )
      psaux->t1_decoder_funcs->done( &decoder );

    return error;
  }